

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O2

void __thiscall EncoderVelocityLocal::PrintFlags(EncoderVelocityLocal *this,ofstream *outFile)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  if ((this->super_EncoderVelocity).velOverflow == true) {
    std::operator<<((ostream *)outFile," VEL_OVF");
  }
  if ((this->super_EncoderVelocity).dirChange == true) {
    std::operator<<((ostream *)outFile," DIR_CHG");
  }
  if ((this->super_EncoderVelocity).encError == true) {
    std::operator<<((ostream *)outFile," ENC_ERR");
  }
  if ((this->super_EncoderVelocity).qtr1Overflow == true) {
    std::operator<<((ostream *)outFile," Q1_OVF");
  }
  if ((this->super_EncoderVelocity).qtr5Overflow == true) {
    std::operator<<((ostream *)outFile," Q5_OVF");
  }
  if ((this->super_EncoderVelocity).qtr1Edges != (this->super_EncoderVelocity).qtr5Edges) {
    poVar1 = std::operator<<((ostream *)outFile," EDGES(");
    GetEdgeString_abi_cxx11_(&local_40,(this->super_EncoderVelocity).qtr1Edges);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    poVar1 = std::operator<<(poVar1,":");
    GetEdgeString_abi_cxx11_(&local_60,(this->super_EncoderVelocity).qtr5Edges);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    std::operator<<(poVar1,")");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((this->super_EncoderVelocity).runOverflow == true) {
    std::operator<<((ostream *)outFile," RUN_OVF");
  }
  return;
}

Assistant:

void EncoderVelocityLocal::PrintFlags(std::ofstream &outFile) const
{
    if (velOverflow)   outFile << " VEL_OVF";
    if (dirChange)     outFile << " DIR_CHG";
    if (encError)      outFile << " ENC_ERR";
    if (qtr1Overflow)  outFile << " Q1_OVF";
    if (qtr5Overflow)  outFile << " Q5_OVF";
    if (qtr1Edges!= qtr5Edges) {
        outFile << " EDGES(" << GetEdgeString(qtr1Edges)
                << ":" <<  GetEdgeString(qtr5Edges) << ")";
    }
    if (runOverflow) outFile << " RUN_OVF";
}